

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O0

void Pdr_ManStop(Pdr_Man_t *p)

{
  int iVar1;
  sat_solver *s;
  Vec_Ptr_t *pVVar2;
  Pdr_Set_t *p_00;
  Vec_Int_t *p_01;
  double local_c8;
  double local_b8;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  int local_28;
  int local_24;
  int k;
  int i;
  sat_solver *pSat;
  Pdr_Set_t *pCla;
  Pdr_Man_t *p_local;
  
  Gia_ManStopP(&p->pGia);
  Aig_ManCleanMarkAB(p->pAig);
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,
              "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n",
              ((double)p->nCallsS * 100.0) / (double)p->nCalls,(ulong)(uint)p->nBlocks,
              (ulong)(uint)p->nObligs,(ulong)(uint)p->nCubes,(ulong)(uint)p->nCalls,p->nCexesTotal,
              p->nStarts);
    Abc_Print(1,"%s =","SAT solving");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_38 = ((double)p->tSat * 100.0) / (double)p->tTotal;
    }
    else {
      local_38 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tSat * 1.0) / 1000000.0,local_38);
    Abc_Print(1,"%s =","  unsat    ");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_48 = ((double)p->tSatUnsat * 100.0) / (double)p->tTotal;
    }
    else {
      local_48 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tSatUnsat * 1.0) / 1000000.0,local_48);
    Abc_Print(1,"%s =","  sat      ");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_58 = ((double)p->tSatSat * 100.0) / (double)p->tTotal;
    }
    else {
      local_58 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tSatSat * 1.0) / 1000000.0,local_58);
    Abc_Print(1,"%s =","Generalize ");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_68 = ((double)p->tGeneral * 100.0) / (double)p->tTotal;
    }
    else {
      local_68 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tGeneral * 1.0) / 1000000.0,local_68);
    Abc_Print(1,"%s =","Push clause");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_78 = ((double)p->tPush * 100.0) / (double)p->tTotal;
    }
    else {
      local_78 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tPush * 1.0) / 1000000.0,local_78);
    Abc_Print(1,"%s =","Ternary sim");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_88 = ((double)p->tTsim * 100.0) / (double)p->tTotal;
    }
    else {
      local_88 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tTsim * 1.0) / 1000000.0,local_88);
    Abc_Print(1,"%s =","Containment");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_98 = ((double)p->tContain * 100.0) / (double)p->tTotal;
    }
    else {
      local_98 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tContain * 1.0) / 1000000.0,local_98);
    Abc_Print(1,"%s =","CNF compute");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_a8 = ((double)p->tCnf * 100.0) / (double)p->tTotal;
    }
    else {
      local_a8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tCnf * 1.0) / 1000000.0,local_a8);
    Abc_Print(1,"%s =","Refinement ");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_b8 = ((double)p->tAbs * 100.0) / (double)p->tTotal;
    }
    else {
      local_b8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tAbs * 1.0) / 1000000.0,local_b8);
    Abc_Print(1,"%s =","TOTAL      ");
    if (((double)p->tTotal != 0.0) || (NAN((double)p->tTotal))) {
      local_c8 = ((double)p->tTotal * 100.0) / (double)p->tTotal;
    }
    else {
      local_c8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->tTotal * 1.0) / 1000000.0,local_c8);
    fflush(_stdout);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vSolvers), local_24 < iVar1; local_24 = local_24 + 1) {
    s = (sat_solver *)Vec_PtrEntry(p->vSolvers,local_24);
    sat_solver_delete(s);
  }
  Vec_PtrFree(p->vSolvers);
  for (local_24 = 0; iVar1 = Vec_VecSize(p->vClauses), local_24 < iVar1; local_24 = local_24 + 1) {
    local_28 = 0;
    while( true ) {
      pVVar2 = Vec_VecEntry(p->vClauses,local_24);
      iVar1 = Vec_PtrSize(pVVar2);
      if (iVar1 <= local_28) break;
      pVVar2 = Vec_VecEntry(p->vClauses,local_24);
      p_00 = (Pdr_Set_t *)Vec_PtrEntry(pVVar2,local_28);
      Pdr_SetDeref(p_00);
      local_28 = local_28 + 1;
    }
  }
  Vec_VecFree(p->vClauses);
  Pdr_QueueStop(p);
  if (p->pOrder != (int *)0x0) {
    free(p->pOrder);
    p->pOrder = (int *)0x0;
  }
  Vec_IntFree(p->vActVars);
  Cnf_DataFree(p->pCnf1);
  Vec_IntFreeP(&p->vVar2Reg);
  Cnf_DataFree(p->pCnf2);
  if (p->pvId2Vars != (Vec_Int_t *)0x0) {
    for (local_24 = 0; iVar1 = Aig_ManObjNumMax(p->pAig), local_24 < iVar1; local_24 = local_24 + 1)
    {
      if (p->pvId2Vars[local_24].pArray != (int *)0x0) {
        free(p->pvId2Vars[local_24].pArray);
        p->pvId2Vars[local_24].pArray = (int *)0x0;
      }
    }
  }
  if (p->pvId2Vars != (Vec_Int_t *)0x0) {
    free(p->pvId2Vars);
    p->pvId2Vars = (Vec_Int_t *)0x0;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(&p->vVar2Ids), local_24 < iVar1; local_24 = local_24 + 1) {
    p_01 = (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids,local_24);
    Vec_IntFree(p_01);
  }
  if ((p->vVar2Ids).pArray != (void **)0x0) {
    free((p->vVar2Ids).pArray);
    (p->vVar2Ids).pArray = (void **)0x0;
  }
  Vec_WecFreeP(&p->vVLits);
  Cnf_ManStop(p->pCnfMan);
  Vec_IntFreeP(&p->vAbsFlops);
  Vec_IntFreeP(&p->vMapFf2Ppi);
  Vec_IntFreeP(&p->vMapPpi2Ff);
  if (p->pPars->fNewXSim != 0) {
    Txs3_ManStop(p->pTxs3);
  }
  Vec_IntFreeP(&p->vPrio);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vCiObjs);
  Vec_IntFree(p->vCoObjs);
  Vec_IntFree(p->vCiVals);
  Vec_IntFree(p->vCoVals);
  Vec_IntFree(p->vNodes);
  Vec_IntFree(p->vUndo);
  Vec_IntFree(p->vVisits);
  Vec_IntFree(p->vCi2Rem);
  Vec_IntFree(p->vRes);
  Vec_PtrFreeP(&p->vInfCubes);
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(p->vCexes);
  }
  if (p->pAig->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(p->pAig);
  }
  if ((p->pAig->pTerSimData != (uint *)0x0) && (p->pAig->pTerSimData != (uint *)0x0)) {
    free(p->pAig->pTerSimData);
    p->pAig->pTerSimData = (uint *)0x0;
  }
  if (p != (Pdr_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Pdr_ManStop( Pdr_Man_t * p )
{
    Pdr_Set_t * pCla;
    sat_solver * pSat;
    int i, k;
    Gia_ManStopP( &p->pGia );
    Aig_ManCleanMarkAB( p->pAig );
    if ( p->pPars->fVerbose ) 
    {
        Abc_Print( 1, "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n", 
            p->nBlocks, p->nObligs, p->nCubes, p->nCalls, 100.0 * p->nCallsS / p->nCalls, p->nCexesTotal, p->nStarts );
        ABC_PRTP( "SAT solving", p->tSat,       p->tTotal );
        ABC_PRTP( "  unsat    ", p->tSatUnsat,  p->tTotal );
        ABC_PRTP( "  sat      ", p->tSatSat,    p->tTotal );
        ABC_PRTP( "Generalize ", p->tGeneral,   p->tTotal );
        ABC_PRTP( "Push clause", p->tPush,      p->tTotal );
        ABC_PRTP( "Ternary sim", p->tTsim,      p->tTotal );
        ABC_PRTP( "Containment", p->tContain,   p->tTotal );
        ABC_PRTP( "CNF compute", p->tCnf,       p->tTotal );
        ABC_PRTP( "Refinement ", p->tAbs,       p->tTotal );
        ABC_PRTP( "TOTAL      ", p->tTotal,     p->tTotal );
        fflush( stdout );
    }
//    Abc_Print( 1, "SS =%6d. SU =%6d. US =%6d. UU =%6d.\n", p->nCasesSS, p->nCasesSU, p->nCasesUS, p->nCasesUU );
    Vec_PtrForEachEntry( sat_solver *, p->vSolvers, pSat, i )
        sat_solver_delete( pSat );
    Vec_PtrFree( p->vSolvers );
    Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pCla, i, k )
        Pdr_SetDeref( pCla );
    Vec_VecFree( p->vClauses );
    Pdr_QueueStop( p );
    ABC_FREE( p->pOrder );
    Vec_IntFree( p->vActVars );
    // static CNF
    Cnf_DataFree( p->pCnf1 );
    Vec_IntFreeP( &p->vVar2Reg );
    // dynamic CNF
    Cnf_DataFree( p->pCnf2 );
    if ( p->pvId2Vars )
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        ABC_FREE( p->pvId2Vars[i].pArray );
    ABC_FREE( p->pvId2Vars );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vVar2Ids );
    for ( i = 0; i < Vec_PtrSize(&p->vVar2Ids); i++ )
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids, i) );
    ABC_FREE( p->vVar2Ids.pArray );
    Vec_WecFreeP( &p->vVLits );
    // CNF manager
    Cnf_ManStop( p->pCnfMan );
    Vec_IntFreeP( &p->vAbsFlops );
    Vec_IntFreeP( &p->vMapFf2Ppi );
    Vec_IntFreeP( &p->vMapPpi2Ff );
    // terminary simulation
    if ( p->pPars->fNewXSim )
        Txs3_ManStop( p->pTxs3 );
    // internal use
    Vec_IntFreeP( &p->vPrio   );  // priority flops
    Vec_IntFree( p->vLits     );  // array of literals
    Vec_IntFree( p->vCiObjs   );  // cone leaves
    Vec_IntFree( p->vCoObjs   );  // cone roots
    Vec_IntFree( p->vCiVals   );  // cone leaf values
    Vec_IntFree( p->vCoVals   );  // cone root values
    Vec_IntFree( p->vNodes    );  // cone nodes
    Vec_IntFree( p->vUndo     );  // cone undos
    Vec_IntFree( p->vVisits   );  // intermediate
    Vec_IntFree( p->vCi2Rem   );  // CIs to be removed
    Vec_IntFree( p->vRes      );  // final result
    Vec_PtrFreeP( &p->vInfCubes );
    ABC_FREE( p->pTime4Outs );
    if ( p->vCexes )
        Vec_PtrFreeFree( p->vCexes );
    // additional AIG data-members
    if ( p->pAig->pFanData != NULL )
        Aig_ManFanoutStop( p->pAig );
    if ( p->pAig->pTerSimData != NULL )
        ABC_FREE( p->pAig->pTerSimData );
    ABC_FREE( p );
}